

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_solve.cpp
# Opt level: O2

void __thiscall Clasp::mt::ParallelSolve::SharedData::clearQueue(SharedData *this)

{
  uint uVar1;
  ebo *this_00;
  
  while( true ) {
    uVar1 = (this->workQ).qFront;
    if (uVar1 == (this->workQ).vec.ebo_.size) break;
    (this->workQ).qFront = uVar1 + 1;
    this_00 = &(this->workQ).vec.ebo_.buf[uVar1]->ebo_;
    if (this_00 != (ebo *)0x0) {
      bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::ebo::~ebo(this_00);
    }
    operator_delete(this_00);
  }
  (this->workQ).vec.ebo_.size = 0;
  (this->workQ).qFront = 0;
  return;
}

Assistant:

void clearQueue() {
		while (!workQ.empty()) { delete workQ.pop_ret(); }
		workQ.clear();
	}